

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jcapimin.c
# Opt level: O0

void jpeg_finish_compress(j_compress_ptr cinfo)

{
  int iVar1;
  long *in_RDI;
  JDIMENSION iMCU_row;
  undefined4 in_stack_fffffffffffffff0;
  uint in_stack_fffffffffffffff4;
  
  if ((*(int *)((long)in_RDI + 0x24) == 0x65) || (*(int *)((long)in_RDI + 0x24) == 0x66)) {
    if (*(uint *)(in_RDI + 0x26) < *(uint *)((long)in_RDI + 0x34)) {
      *(undefined4 *)(*in_RDI + 0x28) = 0x43;
      (**(code **)*in_RDI)(in_RDI);
    }
    (**(code **)(in_RDI[0x36] + 0x10))(in_RDI);
  }
  else if (*(int *)((long)in_RDI + 0x24) != 0x67) {
    *(undefined4 *)(*in_RDI + 0x28) = 0x14;
    *(undefined4 *)(*in_RDI + 0x2c) = *(undefined4 *)((long)in_RDI + 0x24);
    (**(code **)*in_RDI)(in_RDI);
  }
  while (*(int *)(in_RDI[0x36] + 0x1c) == 0) {
    (**(code **)in_RDI[0x36])(in_RDI);
    for (in_stack_fffffffffffffff4 = 0; in_stack_fffffffffffffff4 < *(uint *)(in_RDI + 0x28);
        in_stack_fffffffffffffff4 = in_stack_fffffffffffffff4 + 1) {
      if (in_RDI[2] != 0) {
        *(ulong *)(in_RDI[2] + 8) = (ulong)in_stack_fffffffffffffff4;
        *(ulong *)(in_RDI[2] + 0x10) = (ulong)*(uint *)(in_RDI + 0x28);
        (**(code **)in_RDI[2])(in_RDI);
      }
      iVar1 = (**(code **)(in_RDI[0x39] + 8))(in_RDI,0);
      if (iVar1 == 0) {
        *(undefined4 *)(*in_RDI + 0x28) = 0x18;
        (**(code **)*in_RDI)(in_RDI);
      }
    }
    (**(code **)(in_RDI[0x36] + 0x10))(in_RDI);
  }
  (**(code **)(in_RDI[0x3a] + 0x18))(in_RDI);
  (**(code **)(in_RDI[5] + 0x20))(in_RDI);
  jpeg_abort((j_common_ptr)CONCAT44(in_stack_fffffffffffffff4,in_stack_fffffffffffffff0));
  return;
}

Assistant:

GLOBAL(void)
jpeg_finish_compress(j_compress_ptr cinfo)
{
  JDIMENSION iMCU_row;

  if (cinfo->global_state == CSTATE_SCANNING ||
      cinfo->global_state == CSTATE_RAW_OK) {
    /* Terminate first pass */
    if (cinfo->next_scanline < cinfo->image_height)
      ERREXIT(cinfo, JERR_TOO_LITTLE_DATA);
    (*cinfo->master->finish_pass) (cinfo);
  } else if (cinfo->global_state != CSTATE_WRCOEFS)
    ERREXIT1(cinfo, JERR_BAD_STATE, cinfo->global_state);
  /* Perform any remaining passes */
  while (!cinfo->master->is_last_pass) {
    (*cinfo->master->prepare_for_pass) (cinfo);
    for (iMCU_row = 0; iMCU_row < cinfo->total_iMCU_rows; iMCU_row++) {
      if (cinfo->progress != NULL) {
        cinfo->progress->pass_counter = (long)iMCU_row;
        cinfo->progress->pass_limit = (long)cinfo->total_iMCU_rows;
        (*cinfo->progress->progress_monitor) ((j_common_ptr)cinfo);
      }
      /* We bypass the main controller and invoke coef controller directly;
       * all work is being done from the coefficient buffer.
       */
      if (!(*cinfo->coef->compress_data) (cinfo, (JSAMPIMAGE)NULL))
        ERREXIT(cinfo, JERR_CANT_SUSPEND);
    }
    (*cinfo->master->finish_pass) (cinfo);
  }
  /* Write EOI, do final cleanup */
  (*cinfo->marker->write_file_trailer) (cinfo);
  (*cinfo->dest->term_destination) (cinfo);
  /* We can use jpeg_abort to release memory and reset global_state */
  jpeg_abort((j_common_ptr)cinfo);
}